

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::SourceCodeInfo_Location::InternalSwap
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  void *pvVar2;
  ulong uVar3;
  ArenaStringPtr *pAVar4;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *arena_00;
  string *psVar5;
  ArenaStringPtr *pAVar6;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) != 0) {
LAB_002a78b4:
      other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
      goto LAB_002a78bc;
    }
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002a78b4;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
LAB_002a78bc:
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  RepeatedField<int>::InternalSwap(&this->path_,&other->path_);
  RepeatedField<int>::InternalSwap(&this->span_,&other->span_);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
             &(other->leading_detached_comments_).super_RepeatedPtrFieldBase);
  pAVar6 = &this->leading_comments_;
  arena_00 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar3 = (ulong)arena_00 & 1;
  arena = arena_00;
  if (uVar3 != 0) {
    arena = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  pAVar4 = &other->leading_comments_;
  psVar5 = pAVar6->ptr_;
  if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar4->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_002a7986;
    internal::ArenaStringPtr::CreateInstance
              (pAVar6,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar5 = pAVar6->ptr_;
  }
  if (pAVar4->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar4,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar5);
  arena_00 = (Arena *)this_00->ptr_;
  uVar3 = (ulong)((uint)arena_00 & 1);
LAB_002a7986:
  pAVar6 = &this->trailing_comments_;
  if (uVar3 != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  pAVar4 = &other->trailing_comments_;
  psVar5 = pAVar6->ptr_;
  if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar4->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      return;
    }
    internal::ArenaStringPtr::CreateInstance
              (pAVar6,arena_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar5 = pAVar6->ptr_;
  }
  if (pAVar4->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar4,arena_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar5);
  return;
}

Assistant:

void SourceCodeInfo_Location::InternalSwap(SourceCodeInfo_Location* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  path_.InternalSwap(&other->path_);
  span_.InternalSwap(&other->span_);
  leading_detached_comments_.InternalSwap(&other->leading_detached_comments_);
  leading_comments_.Swap(&other->leading_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  trailing_comments_.Swap(&other->trailing_comments_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
}